

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<double,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<long,duckdb::QuantileStandardType>>
               (QuantileState<long,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  data_ptr_t pdVar2;
  long *v_t;
  _func_int **pp_Var3;
  Vector *pVVar4;
  idx_t iVar5;
  reference pvVar6;
  unsigned_long *q;
  _func_int **pp_Var7;
  FunctionData *pFVar8;
  uint64_t uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QuantileDirect<long> local_a9;
  FunctionData *local_a8;
  list_entry_t *local_a0;
  AggregateFinalizeData *local_98;
  Vector *local_90;
  data_ptr_t local_88;
  vector<duckdb::QuantileValue,_true> *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar8 = (this->bind_data).ptr;
    pVVar4 = ListVector::GetEntry(finalize_data->result);
    iVar5 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar8[2]._vptr_FunctionData - (long)pFVar8[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar5);
    pdVar2 = pVVar4->data;
    v_t = (state->v).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    target->offset = iVar5;
    pp_Var7 = pFVar8[4]._vptr_FunctionData;
    pp_Var3 = pFVar8[5]._vptr_FunctionData;
    if (pp_Var7 != pp_Var3) {
      local_80 = (vector<duckdb::QuantileValue,_true> *)(pFVar8 + 1);
      local_88 = pdVar2 + iVar5 * 8;
      uVar10 = 0;
      local_a8 = pFVar8;
      local_a0 = target;
      local_98 = finalize_data;
      local_90 = pVVar4;
      do {
        pvVar6 = vector<duckdb::QuantileValue,_true>::operator[](local_80,(size_type)*pp_Var7);
        iVar5 = (long)(state->v).super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(state->v).super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        local_78.desc = *(bool *)&local_a8[7]._vptr_FunctionData;
        lVar1 = iVar5 - 1;
        auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar12._0_8_ = lVar1;
        auVar12._12_4_ = 0x45300000;
        dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
        local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                      pvVar6->dbl;
        local_48 = local_78.RN;
        dVar11 = floor(local_78.RN);
        local_78.FRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
        dVar11 = ceil(local_48);
        local_78.CRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
        local_78.begin = uVar10;
        local_78.end = iVar5;
        dVar11 = Interpolator<false>::Operation<long,double,duckdb::QuantileDirect<long>>
                           (&local_78,v_t,local_90,&local_a9);
        *(double *)(local_88 + (long)*pp_Var7 * 8) = dVar11;
        pp_Var7 = pp_Var7 + 1;
        uVar10 = local_78.FRN;
      } while (pp_Var7 != pp_Var3);
      iVar5 = local_a0->offset;
      pFVar8 = local_a8;
      target = local_a0;
      finalize_data = local_98;
    }
    uVar9 = ((long)pFVar8[2]._vptr_FunctionData - (long)pFVar8[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    target->length = uVar9;
    ListVector::SetListSize(finalize_data->result,uVar9 + iVar5);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}